

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall QO_Manager::CondToAttrIdx(QO_Manager *this,int condIndex,int *attrIdx1,int *attrIdx2)

{
  RC RVar1;
  RC rc;
  int *attrIdx2_local;
  int *attrIdx1_local;
  int condIndex_local;
  QO_Manager *this_local;
  
  this_local._4_4_ =
       QL_Manager::GetAttrCatEntryPos(this->qlm,this->conds[condIndex].lhsAttr,attrIdx1);
  if (this_local._4_4_ == 0) {
    if (this->conds[condIndex].bRhsIsAttr == 0) {
      *attrIdx2 = -1;
    }
    else {
      RVar1 = QL_Manager::GetAttrCatEntryPos(this->qlm,this->conds[condIndex].rhsAttr,attrIdx2);
      if (RVar1 != 0) {
        return RVar1;
      }
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QO_Manager::CondToAttrIdx(int condIndex, int &attrIdx1, int &attrIdx2){
  RC rc = 0;
  if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].lhsAttr, attrIdx1)))
    return (rc);
  if(conds[condIndex].bRhsIsAttr){
    if((rc = qlm.GetAttrCatEntryPos(conds[condIndex].rhsAttr, attrIdx2)))
      return (rc);
  }
  else
    attrIdx2 = -1;
  return (0);
}